

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O3

WeierstrassPoint * ecc_weierstrass_point_copy(WeierstrassPoint *orig)

{
  WeierstrassCurve *pWVar1;
  WeierstrassPoint *pWVar2;
  mp_int *pmVar3;
  
  pWVar1 = orig->wc;
  pWVar2 = (WeierstrassPoint *)safemalloc(1,0x20,0);
  pWVar2->wc = pWVar1;
  pWVar2->X = (mp_int *)0x0;
  pWVar2->Y = (mp_int *)0x0;
  pWVar2->Z = (mp_int *)0x0;
  pmVar3 = mp_copy(orig->X);
  pWVar2->X = pmVar3;
  pmVar3 = mp_copy(orig->Y);
  pWVar2->Y = pmVar3;
  pmVar3 = mp_copy(orig->Z);
  pWVar2->Z = pmVar3;
  return pWVar2;
}

Assistant:

WeierstrassPoint *ecc_weierstrass_point_copy(WeierstrassPoint *orig)
{
    WeierstrassPoint *wp = ecc_weierstrass_point_new_empty(orig->wc);
    wp->X = mp_copy(orig->X);
    wp->Y = mp_copy(orig->Y);
    wp->Z = mp_copy(orig->Z);
    return wp;
}